

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_entity_t *
golf_entity_water(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform,
                 golf_geo_t geo,golf_lightmap_section_t lightmap_section)

{
  long lVar1;
  golf_lightmap_section_t *pgVar2;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar3;
  byte bVar4;
  
  bVar4 = 0;
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = WATER_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x60) = transform.position._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x68) = transform._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x70) = transform.rotation._4_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x78) = transform._24_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x80) = transform.scale._4_8_;
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0x88),&geo,0xe8);
  pgVar2 = &lightmap_section;
  paVar3 = &__return_storage_ptr__->field_4;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)paVar3 = *(undefined8 *)pgVar2->lightmap_name;
    pgVar2 = (golf_lightmap_section_t *)((long)pgVar2 + (ulong)bVar4 * -0x10 + 8);
    paVar3 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
             ((long)paVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_water(const char *name, golf_transform_t transform, golf_geo_t geo, golf_lightmap_section_t lightmap_section) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = WATER_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.water.transform = transform;
    entity.water.geo = geo;
    entity.water.lightmap_section = lightmap_section;
    return entity;
}